

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
          (ShaderPerformanceCaseGroup *this,TestContext *testCtx,char *name,char *description)

{
  InitialCalibration *pIVar1;
  SharedPtrStateBase *pSVar2;
  
  tcu::TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,testCtx,name,description);
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderPerformanceCaseGroup_00782ed8;
  pIVar1 = (InitialCalibration *)operator_new(4);
  pIVar1->initialNumCalls = 1;
  (this->m_initialCalibrationStorage).m_state = (SharedPtrStateBase *)0x0;
  (this->m_initialCalibrationStorage).m_ptr = pIVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00782f28;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pIVar1;
  (this->m_initialCalibrationStorage).m_state = pSVar2;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  return;
}

Assistant:

ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup (tcu::TestContext& testCtx, const char* name, const char* description)
	: TestCaseGroup					(testCtx, name, description)
	, m_initialCalibrationStorage	(new ShaderPerformanceCase::InitialCalibration)
{
}